

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O2

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::ConsoleScopeActivationObject>::GetPropertyReferenceQuery
          (CrossSiteObject<Js::ConsoleScopeActivationObject> *this,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  Var pvVar2;
  
  pvVar2 = CrossSite::MarshalVar
                     ((((((this->super_ConsoleScopeActivationObject).super_ActivationObject.
                          super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                       ptr)->super_JavascriptLibraryBase).scriptContext.ptr,originalInstance,false);
  PVar1 = DynamicObject::GetPropertyReferenceQuery
                    ((DynamicObject *)this,pvVar2,propertyId,value,info,requestContext);
  if (PVar1 == Property_Found) {
    pvVar2 = CrossSite::MarshalVar(requestContext,*value,false);
    *value = pvVar2;
  }
  return PVar1;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetPropertyReferenceQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetPropertyReferenceQuery(originalInstance, propertyId, value, info, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }